

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serving_request.cpp
# Opt level: O0

void __thiscall foxxll::serving_request::serve(serving_request *this)

{
  file *pfVar1;
  io_error *ex;
  serving_request *this_local;
  
  request::check_nref((request *)this,false);
  pfVar1 = (this->super_request_with_state).super_request_with_waiters.super_request.file_;
  (*pfVar1->_vptr_file[2])
            (pfVar1,(this->super_request_with_state).super_request_with_waiters.super_request.
                    buffer_,
             (this->super_request_with_state).super_request_with_waiters.super_request.offset_,
             (this->super_request_with_state).super_request_with_waiters.super_request.bytes_,
             (ulong)(this->super_request_with_state).super_request_with_waiters.super_request.op_);
  request::check_nref((request *)this,true);
  (**(code **)(*(long *)&(this->super_request_with_state).super_request_with_waiters.super_request +
              0x18))(this,0);
  return;
}

Assistant:

void serving_request::serve()
{
    check_nref();
    TLX_LOG
        << "serving_request[" << static_cast<void*>(this) << "]::serve(): "
        << buffer_ << " @ ["
        << file_ << "|" << file_->get_allocator_id() << "]0x"
        << std::hex << std::setfill('0') << std::setw(8)
        << offset_ << "/0x" << bytes_
        << (op_ == request::READ ? " READ" : " WRITE");

    try
    {
        file_->serve(buffer_, offset_, bytes_, op_);
    }
    catch (const io_error& ex)
    {
        error_occured(ex.what());
    }

    check_nref(true);

    completed(false);
}